

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O2

void Cut_OracleStop(Cut_Oracle_t *p)

{
  int level;
  
  puts("Cut computation statistics with oracle:");
  level = 0x701b85;
  printf("Current cuts      = %8d. (Trivial = %d.)\n",(ulong)(uint)(p->nCuts - p->nCutsTriv));
  Abc_Print(level,"%s =","Total time ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  if (p->vCuts0 != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCuts0);
  }
  if (p->vCuts1 != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCuts1);
  }
  if (p->vCutsNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCutsNew);
  }
  if (p->vFanCounts != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vFanCounts);
  }
  if (p->vNodeCuts != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vNodeCuts);
  }
  if (p->vNodeStarts != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vNodeStarts);
  }
  if (p->vCutPairs != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vCutPairs);
  }
  Extra_MmFixedStop(p->pMmCuts);
  free(p);
  return;
}

Assistant:

void Cut_OracleStop( Cut_Oracle_t * p )
{
//    if ( p->pParams->fVerbose )
    {
        printf( "Cut computation statistics with oracle:\n" );
        printf( "Current cuts      = %8d. (Trivial = %d.)\n", p->nCuts-p->nCutsTriv, p->nCutsTriv );
        ABC_PRT( "Total time ", p->timeTotal );
    }

    if ( p->vCuts0 )      Vec_PtrFree( p->vCuts0 );
    if ( p->vCuts1 )      Vec_PtrFree( p->vCuts1 );
    if ( p->vCutsNew )    Vec_PtrFree( p->vCutsNew );
    if ( p->vFanCounts )  Vec_IntFree( p->vFanCounts );

    if ( p->vNodeCuts )   Vec_IntFree( p->vNodeCuts );
    if ( p->vNodeStarts ) Vec_IntFree( p->vNodeStarts );
    if ( p->vCutPairs )   Vec_IntFree( p->vCutPairs );

    Extra_MmFixedStop( p->pMmCuts );
    ABC_FREE( p ); 
}